

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O1

int get_parts(void)

{
  CURLUcode CVar1;
  uint uVar2;
  CURLUcode CVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  testcase *ptVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  char buf [256];
  long local_150;
  char *local_148;
  char *local_140;
  char local_138 [264];
  
  local_148 = "user:moo@ftp.example.com/color/#green?no-black";
  lVar10 = 0;
  ptVar8 = get_parts_list;
  iVar12 = 0;
  do {
    lVar5 = curl_url();
    pcVar13 = local_148;
    if (lVar5 == 0) {
      iVar12 = 1;
    }
    else {
      CVar1 = ptVar8->ucode;
      CVar3 = curl_url_set(lVar5,0,local_148,ptVar8->urlflags);
      if (CVar3 == CVar1) {
        if (CVar1 == CURLUE_OK) {
          local_140 = ptVar8->out;
          uVar2 = ptVar8->getflags;
          local_138[0] = '\0';
          lVar11 = 0x100;
          lVar9 = 0;
          pcVar13 = local_138;
          do {
            local_150 = 0;
            iVar4 = curl_url_get(lVar5,*(undefined4 *)((long)&DAT_0010ad00 + lVar9),&local_150,uVar2
                                );
            pcVar7 = " | ";
            if (local_138[0] == '\0') {
              pcVar7 = "";
            }
            if (local_150 == 0 || iVar4 != 0) {
              curl_msnprintf(pcVar13,lVar11,"%s[%d]",pcVar7,iVar4);
            }
            else {
              curl_msnprintf(pcVar13,lVar11,"%s%s",pcVar7);
            }
            sVar6 = strlen(pcVar13);
            pcVar13 = pcVar13 + sVar6;
            lVar11 = lVar11 - sVar6;
            curl_free(local_150);
            pcVar7 = local_140;
            lVar9 = lVar9 + 0x10;
          } while (lVar9 != 0x90);
          iVar4 = strcmp(local_138,local_140);
          if (iVar4 != 0) {
            curl_mfprintf(_stderr,"in: %s\nwanted: %s\ngot:    %s\n",local_148,pcVar7,local_138);
            goto LAB_00104f31;
          }
        }
      }
      else {
        curl_mfprintf(_stderr,"Get parts\nin: %s\nreturned %d (expected %d)\n",pcVar13,CVar3,CVar1);
LAB_00104f31:
        iVar12 = 1;
      }
      curl_url_cleanup(lVar5);
    }
    if (lVar5 == 0) {
      return iVar12;
    }
    lVar10 = lVar10 + 1;
    local_148 = get_parts_list[lVar10].in;
    if (local_148 == (char *)0x0) {
      return iVar12;
    }
    ptVar8 = get_parts_list + lVar10;
    if (iVar12 != 0) {
      return iVar12;
    }
  } while( true );
}

Assistant:

static int get_parts(void)
{
  int i;
  int error = 0;
  for(i = 0; get_parts_list[i].in && !error; i++) {
    CURLUcode rc;
    CURLU *urlp = curl_url();
    if(!urlp) {
      error++;
      break;
    }
    rc = curl_url_set(urlp, CURLUPART_URL,
                      get_parts_list[i].in,
                      get_parts_list[i].urlflags);
    if(rc != get_parts_list[i].ucode) {
      fprintf(stderr, "Get parts\nin: %s\nreturned %d (expected %d)\n",
              get_parts_list[i].in, (int)rc, get_parts_list[i].ucode);
      error++;
    }
    else if(get_parts_list[i].ucode) {
      /* the expected error happened */
    }
    else if(checkparts(urlp, get_parts_list[i].in, get_parts_list[i].out,
                       get_parts_list[i].getflags))
      error++;
    curl_url_cleanup(urlp);
  }
  return error;
}